

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::CreateAndSetGlobalGenerator(cmake *this,string *name,bool allowArch)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_120;
  undefined4 local_114;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  string local_b0;
  string_view local_90;
  undefined1 local_70 [8];
  string vsError;
  string kdevError;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  bool allowArch_local;
  string *name_local;
  cmake *this_local;
  
  CreateGlobalGenerator((cmake *)((long)&kdevError.field_2 + 8),(string *)this,SUB81(name,0));
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(kdevError.field_2._M_local_buf + 8))
  ;
  if (bVar1) {
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::unique_ptr
              (&local_120,
               (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
               ((long)&kdevError.field_2 + 8));
    SetGlobalGenerator(this,&local_120);
    std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
              (&local_120);
    this_local._7_1_ = true;
    local_114 = 1;
  }
  else {
    std::__cxx11::string::string((string *)(vsError.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_70);
    lVar2 = std::__cxx11::string::find((char *)name,0xbc52e6);
    if (lVar2 != -1) {
      std::__cxx11::string::operator=
                ((string *)(vsError.field_2._M_local_buf + 8),
                 "\nThe KDevelop3 generator is not supported anymore.");
    }
    if (!allowArch) {
      local_90 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)name);
      bVar1 = cmHasLiteralPrefix<15ul>(local_90,(char (*) [15])"Visual Studio ");
      if (bVar1) {
        uVar3 = std::__cxx11::string::length();
        sVar4 = cmStrLen<23ul>((char (*) [23])"Visual Studio xx xxxx ");
        if (sVar4 <= uVar3) {
          std::__cxx11::string::operator=
                    ((string *)local_70,
                     "\nUsing platforms in Visual Studio generator names is not supported in CMakePresets.json."
                    );
        }
      }
    }
    cmAlphaNum::cmAlphaNum(&local_e0,"Could not create named generator ");
    cmAlphaNum::cmAlphaNum(&local_110,name);
    cmStrCat<std::__cxx11::string,std::__cxx11::string>
              (&local_b0,&local_e0,&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&vsError.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    cmSystemTools::Error(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    PrintGeneratorList(this);
    this_local._7_1_ = false;
    local_114 = 1;
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)(vsError.field_2._M_local_buf + 8));
  }
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
             ((long)&kdevError.field_2 + 8));
  return this_local._7_1_;
}

Assistant:

bool cmake::CreateAndSetGlobalGenerator(const std::string& name,
                                        bool allowArch)
{
  auto gen = this->CreateGlobalGenerator(name, allowArch);
  if (!gen) {
    std::string kdevError;
    std::string vsError;
    if (name.find("KDevelop3", 0) != std::string::npos) {
      kdevError = "\nThe KDevelop3 generator is not supported anymore.";
    }
    if (!allowArch && cmHasLiteralPrefix(name, "Visual Studio ") &&
        name.length() >= cmStrLen("Visual Studio xx xxxx ")) {
      vsError = "\nUsing platforms in Visual Studio generator names is not "
                "supported in CMakePresets.json.";
    }

    cmSystemTools::Error(
      cmStrCat("Could not create named generator ", name, kdevError, vsError));
    this->PrintGeneratorList();
    return false;
  }

  this->SetGlobalGenerator(std::move(gen));
  return true;
}